

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

TestCase * __thiscall
testing::internal::UnitTestImpl::GetTestCase
          (UnitTestImpl *this,char *test_case_name,char *type_param,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  reference ppTVar4;
  TestCase *pTVar5;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  char *in_RSI;
  long in_RDI;
  TestCase *new_test_case;
  const_iterator test_case;
  string *in_stack_fffffffffffffe98;
  TestCaseNameIs *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  TestCaseNameIs *in_stack_ffffffffffffff08;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  TestCase *in_stack_ffffffffffffff30;
  const_iterator in_stack_ffffffffffffff38;
  allocator local_91;
  string local_90 [64];
  TestCase **local_50;
  TestCase **local_48;
  TestCase **local_40;
  __normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  local_38 [4];
  char *local_18;
  TestCase *local_8;
  
  local_18 = in_RSI;
  local_48 = (TestCase **)
             std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::begin
                       ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                        in_stack_fffffffffffffe98);
  local_50 = (TestCase **)
             std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::end
                       ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                        in_stack_fffffffffffffe98);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar1,&local_91);
  TestCaseNameIs::TestCaseNameIs(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_40 = (TestCase **)
             std::
             find_if<__gnu_cxx::__normal_iterator<testing::TestCase**,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>,testing::internal::TestCaseNameIs>
                       (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                        in_stack_ffffffffffffff08);
  __gnu_cxx::
  __normal_iterator<testing::TestCase*const*,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>
  ::__normal_iterator<testing::TestCase**>
            ((__normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
              *)in_stack_fffffffffffffea0,
             (__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
              *)in_stack_fffffffffffffe98);
  TestCaseNameIs::~TestCaseNameIs((TestCaseNameIs *)0x150379);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::end
            ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
             in_stack_fffffffffffffe98);
  bVar2 = __gnu_cxx::operator!=
                    ((__normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                      *)in_stack_fffffffffffffea0,
                     (__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                      *)in_stack_fffffffffffffe98);
  if (bVar2) {
    ppTVar4 = __gnu_cxx::
              __normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
              ::operator*(local_38);
    local_8 = *ppTVar4;
  }
  else {
    pTVar5 = (TestCase *)operator_new(0xf8);
    TestCase::TestCase(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                       in_stack_ffffffffffffff20,
                       (SetUpTestCaseFunc)in_stack_ffffffffffffff18._M_current,
                       (TearDownTestCaseFunc)in_stack_ffffffffffffff10._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff28,local_18,(allocator *)&stack0xffffffffffffff27);
    bVar3 = UnitTestOptions::MatchesFilter
                      (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
    if ((bVar3 & 1) == 0) {
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::push_back
                ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                 CONCAT17(bVar3,in_stack_fffffffffffffeb0),(value_type *)in_stack_fffffffffffffea8);
    }
    else {
      *(int *)(in_RDI + 0x104) = *(int *)(in_RDI + 0x104) + 1;
      this_00 = (__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                 *)(in_RDI + 0xb8);
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::begin
                ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                 in_stack_fffffffffffffe98);
      __gnu_cxx::
      __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
      ::operator+(this_00,(difference_type)in_stack_fffffffffffffea0);
      __gnu_cxx::
      __normal_iterator<testing::TestCase*const*,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>
      ::__normal_iterator<testing::TestCase**>
                ((__normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                  *)in_stack_fffffffffffffea0,
                 (__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                  *)in_stack_fffffffffffffe98);
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::insert
                ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,in_stack_ffffffffffffff28);
    }
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0));
    std::vector<int,_std::allocator<int>_>::push_back
              (this_01,(value_type_conflict1 *)in_stack_fffffffffffffe98);
    local_8 = pTVar5;
  }
  return local_8;
}

Assistant:

TestCase* UnitTestImpl::GetTestCase(const char* test_case_name,
                                    const char* type_param,
                                    Test::SetUpTestCaseFunc set_up_tc,
                                    Test::TearDownTestCaseFunc tear_down_tc) {
  // Can we find a TestCase with the given name?
  const std::vector<TestCase*>::const_iterator test_case =
      std::find_if(test_cases_.begin(), test_cases_.end(),
                   TestCaseNameIs(test_case_name));

  if (test_case != test_cases_.end())
    return *test_case;

  // No.  Let's create one.
  TestCase* const new_test_case =
      new TestCase(test_case_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test case?
  if (internal::UnitTestOptions::MatchesFilter(test_case_name,
                                               kDeathTestCaseFilter)) {
    // Yes.  Inserts the test case after the last death test case
    // defined so far.  This only works when the test cases haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_case_;
    test_cases_.insert(test_cases_.begin() + last_death_test_case_,
                       new_test_case);
  } else {
    // No.  Appends to the end of the list.
    test_cases_.push_back(new_test_case);
  }

  test_case_indices_.push_back(static_cast<int>(test_case_indices_.size()));
  return new_test_case;
}